

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::Init
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          MeshEdgebreakerEncoder *encoder)

{
  pointer piVar1;
  EncoderOptions *this_00;
  EncoderOptionsBase<int> *this_01;
  bool bVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  this->encoder_ = encoder;
  this->mesh_ = (encoder->super_MeshEncoder).mesh_;
  piVar1 = (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish != piVar1) {
    (this->attribute_encoder_to_data_id_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  this_00 = (encoder->super_MeshEncoder).super_PointCloudEncoder.options_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"split_mesh_on_seams",&local_39);
  bVar2 = Options::IsOptionSet((Options *)this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.options_;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"split_mesh_on_seams",&local_39);
    bVar2 = Options::GetBool((Options *)this_01,&local_38,false);
    this->use_single_connectivity_ = bVar2;
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    iVar3 = EncoderOptionsBase<int>::GetSpeed(this_01);
    if (iVar3 < 6) {
      this->use_single_connectivity_ = false;
    }
    else {
      this->use_single_connectivity_ = true;
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::Init(
    MeshEdgebreakerEncoder *encoder) {
  encoder_ = encoder;
  mesh_ = encoder->mesh();
  attribute_encoder_to_data_id_map_.clear();

  if (encoder_->options()->IsGlobalOptionSet("split_mesh_on_seams")) {
    use_single_connectivity_ =
        encoder_->options()->GetGlobalBool("split_mesh_on_seams", false);
  } else if (encoder_->options()->GetSpeed() >= 6) {
    // Else use default setting based on speed.
    use_single_connectivity_ = true;
  } else {
    use_single_connectivity_ = false;
  }
  return true;
}